

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_remove_many(roaring_bitmap_t *r,size_t n_args,uint32_t *vals)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  uint16_t *puVar4;
  long lVar5;
  int *c;
  int *piVar6;
  ulong uVar7;
  ushort uVar8;
  uint8_t uVar9;
  ulong uVar10;
  uint uVar11;
  size_t i;
  size_t sVar12;
  uint i_00;
  uint uVar13;
  uint uVar14;
  bool bVar15;
  uint8_t new_typecode;
  uint8_t local_41;
  size_t local_40;
  uint32_t *local_38;
  
  if ((n_args != 0) && ((r->high_low_container).size != 0)) {
    i_00 = 0xffffffff;
    sVar12 = 0;
    local_40 = n_args;
    local_38 = vals;
    do {
      uVar2 = local_38[sVar12];
      uVar8 = (ushort)(uVar2 >> 0x10);
      if (((int)i_00 < 0) || (uVar2 >> 0x10 != (uint)(r->high_low_container).keys[i_00])) {
        iVar3 = (r->high_low_container).size;
        if (((long)iVar3 == 0) ||
           (puVar4 = (r->high_low_container).keys, puVar4[(long)iVar3 + -1] == uVar8)) {
          i_00 = iVar3 - 1;
        }
        else {
          uVar13 = iVar3 - 1;
          uVar11 = 0;
          uVar14 = uVar13;
          do {
            if ((int)uVar13 < (int)uVar11) {
              i_00 = ~uVar11;
              break;
            }
            i_00 = uVar11 + uVar13 >> 1;
            uVar1 = *(ushort *)((long)puVar4 + (ulong)(uVar11 + uVar13 & 0xfffffffe));
            if (uVar1 < uVar8) {
              uVar11 = i_00 + 1;
              bVar15 = true;
              i_00 = uVar14;
            }
            else if (uVar8 < uVar1) {
              uVar13 = i_00 - 1;
              bVar15 = true;
              i_00 = uVar14;
            }
            else {
              bVar15 = false;
            }
            uVar14 = i_00;
          } while (bVar15);
        }
      }
      if (-1 < (int)i_00) {
        c = (int *)container_remove((r->high_low_container).containers[i_00],(uint16_t)uVar2,
                                    (r->high_low_container).typecodes[i_00],&local_41);
        piVar6 = (int *)(r->high_low_container).containers[i_00];
        if (c != piVar6) {
          container_free(piVar6,(r->high_low_container).typecodes[i_00]);
          (r->high_low_container).keys[i_00] = uVar8;
          (r->high_low_container).containers[i_00] = c;
          (r->high_low_container).typecodes[i_00] = local_41;
        }
        piVar6 = c;
        uVar9 = local_41;
        if (local_41 == '\x04') {
          uVar9 = (uint8_t)c[2];
          piVar6 = *(int **)c;
        }
        iVar3 = *piVar6;
        if ((uVar9 == '\x03') || (uVar9 == '\x02')) {
          bVar15 = 0 < iVar3;
        }
        else {
          if (iVar3 == -1) {
            if (**(long **)(piVar6 + 2) == 0) {
              uVar7 = 0xffffffffffffffff;
              do {
                if (uVar7 == 0x3fe) {
                  uVar10 = 0x3ff;
                  break;
                }
                uVar10 = uVar7 + 1;
                lVar5 = uVar7 + 2;
                uVar7 = uVar10;
              } while ((*(long **)(piVar6 + 2))[lVar5] == 0);
              bVar15 = 0x3fe < uVar10;
            }
            else {
              bVar15 = false;
            }
          }
          else {
            bVar15 = iVar3 == 0;
          }
          bVar15 = (bool)(bVar15 ^ 1);
        }
        if (!bVar15) {
          container_free(c,local_41);
          ra_remove_at_index(&r->high_low_container,i_00);
          i_00 = 0xffffffff;
        }
      }
      sVar12 = sVar12 + 1;
    } while (sVar12 != local_40);
  }
  return;
}

Assistant:

void roaring_bitmap_remove_many(roaring_bitmap_t *r, size_t n_args,
                                const uint32_t *vals) {
    if (n_args == 0 || r->high_low_container.size == 0) {
        return;
    }
    int32_t pos =
        -1;  // position of the container used in the previous iteration
    for (size_t i = 0; i < n_args; i++) {
        uint16_t key = (uint16_t)(vals[i] >> 16);
        if (pos < 0 || key != r->high_low_container.keys[pos]) {
            pos = ra_get_index(&r->high_low_container, key);
        }
        if (pos >= 0) {
            uint8_t new_typecode;
            container_t *new_container;
            new_container = container_remove(
                r->high_low_container.containers[pos], vals[i] & 0xffff,
                r->high_low_container.typecodes[pos], &new_typecode);
            if (new_container != r->high_low_container.containers[pos]) {
                container_free(r->high_low_container.containers[pos],
                               r->high_low_container.typecodes[pos]);
                ra_replace_key_and_container_at_index(&r->high_low_container,
                                                      pos, key, new_container,
                                                      new_typecode);
            }
            if (!container_nonzero_cardinality(new_container, new_typecode)) {
                container_free(new_container, new_typecode);
                ra_remove_at_index(&r->high_low_container, pos);
                pos = -1;
            }
        }
    }
}